

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_31::HttpChunkedEntityReader::tryReadInternal
          (HttpChunkedEntityReader *this,void *buffer,size_t minBytes,size_t maxBytes,
          size_t alreadyRead)

{
  ulong maxBytes_00;
  long lVar1;
  PromiseBase PVar2;
  PromiseBase PVar3;
  undefined8 uVar4;
  int iVar5;
  TransformPromiseNodeBase *pTVar6;
  undefined4 extraout_var;
  HttpInputStreamImpl *pHVar7;
  HttpChunkedEntityReader *pHVar8;
  HttpInputStreamImpl *this_00;
  ChainPromiseNode *pCVar9;
  ChainPromiseNode *extraout_RDX;
  ChainPromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  _func_int **in_R9;
  Own<kj::_::ImmediatePromiseNode<unsigned_long>_> OVar10;
  Own<kj::_::ChainPromiseNode> OVar11;
  Fault f;
  undefined1 local_68 [16];
  undefined1 local_58 [24];
  TransformPromiseNodeBase *local_40;
  HttpChunkedEntityReader *local_38;
  undefined4 extraout_var_00;
  
  if (*(char *)((long)buffer + 0x10) == '\x01') {
    OVar10 = heap<kj::_::ImmediatePromiseNode<unsigned_long>,unsigned_long>
                       ((kj *)local_68,(unsigned_long *)(local_58 + 0x10));
    (this->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream =
         (_func_int **)local_68._0_8_;
    (this->super_HttpEntityBodyReader).inner = (HttpInputStreamImpl *)local_68._8_8_;
    return (Promise<unsigned_long>)OVar10;
  }
  maxBytes_00 = *(ulong *)((long)buffer + 0x18);
  local_38 = this;
  if (maxBytes_00 == 0) {
    lVar1 = *(long *)((long)buffer + 8);
    if (*(long *)(lVar1 + 0xc0) == 0) {
      local_58._16_8_ = (ArrayDisposer *)0x0;
      local_68._0_8_ = (_func_int **)0x0;
      local_68._8_8_ = (AsyncInputStream *)0x0;
      _::Debug::Fault::init
                ((Fault *)(local_58 + 0x10),
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                );
      _::Debug::Fault::fatal((Fault *)(local_58 + 0x10));
    }
    HttpInputStreamImpl::readHeader
              ((HttpInputStreamImpl *)local_68,(HeaderType)lVar1,1,*(size_t *)(lVar1 + 0x28));
    pHVar7 = (HttpInputStreamImpl *)operator_new(0x28);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)pHVar7,(Own<kj::_::PromiseNode> *)local_68,
               _::
               TransformPromiseNode<unsigned_long,_kj::ArrayPtr<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1130:15),_kj::_::PropagateException>
               ::anon_class_1_0_00000001_for_func::operator());
    uVar4 = local_68._8_8_;
    (pHVar7->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)&PTR_onReady_00441ee0;
    local_58._0_8_ =
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,kj::ArrayPtr<char>,kj::(anonymous_namespace)::HttpInputStreamImpl::readChunkHeader()::{lambda(kj::ArrayPtr<char>)#1},kj::_::PropagateException>>
          ::instance;
    local_58._8_8_ = pHVar7;
    if ((HttpInputStreamImpl *)local_68._8_8_ != (HttpInputStreamImpl *)0x0) {
      local_68._8_8_ = (HttpInputStreamImpl *)0x0;
      (**(code **)*(_func_int **)local_68._0_8_)
                (local_68._0_8_,
                 ((HttpInputStream *)uVar4)->_vptr_HttpInputStream[-2] +
                 (long)&((HttpInputStream *)uVar4)->_vptr_HttpInputStream);
    }
    pTVar6 = (TransformPromiseNodeBase *)operator_new(0x50);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar6,(Own<kj::_::PromiseNode> *)local_58,
               _::
               TransformPromiseNode<kj::Promise<unsigned_long>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1533:43),_kj::_::PropagateException>
               ::anon_class_40_5_00d635ec_for_func::operator());
    (pTVar6->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00441f68;
    pTVar6[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)buffer;
    pTVar6[1].dependency.disposer = (Disposer *)minBytes;
    pTVar6[1].dependency.ptr = (PromiseNode *)maxBytes;
    pTVar6[1].continuationTracePtr = (void *)alreadyRead;
    pTVar6[2].super_PromiseNode._vptr_PromiseNode = in_R9;
    local_58._16_8_ =
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,unsigned_long,kj::(anonymous_namespace)::HttpChunkedEntityReader::tryReadInternal(void*,unsigned_long,unsigned_long,unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
          ::instance;
    local_40 = pTVar6;
    OVar11 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>
                       ((kj *)local_68,(Own<kj::_::PromiseNode> *)(local_58 + 0x10));
    pTVar6 = local_40;
    pCVar9 = OVar11.ptr;
    *(undefined4 *)
     &(local_38->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream =
         local_68._0_4_;
    *(undefined4 *)
     ((long)&(local_38->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream +
     4) = local_68._4_4_;
    *(undefined4 *)&(local_38->super_HttpEntityBodyReader).inner = local_68._8_4_;
    *(undefined4 *)((long)&(local_38->super_HttpEntityBodyReader).inner + 4) = local_68._12_4_;
    pHVar8 = local_38;
    if (local_40 != (TransformPromiseNodeBase *)0x0) {
      local_40 = (TransformPromiseNodeBase *)0x0;
      iVar5 = (***(_func_int ***)local_58._16_8_)
                        (local_58._16_8_,
                         (pTVar6->super_PromiseNode)._vptr_PromiseNode[-2] +
                         (long)&(pTVar6->super_PromiseNode)._vptr_PromiseNode);
      pHVar8 = (HttpChunkedEntityReader *)CONCAT44(extraout_var_00,iVar5);
      pCVar9 = extraout_RDX_00;
    }
  }
  else {
    if (maxBytes <= maxBytes_00) {
      HttpInputStreamImpl::tryRead
                ((HttpInputStreamImpl *)local_68,*(void **)((long)buffer + 8),minBytes,maxBytes);
      this_00 = (HttpInputStreamImpl *)operator_new(0x38);
      _::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)this_00,(Own<kj::_::PromiseNode> *)local_68,
                 _::
                 TransformPromiseNode<unsigned_long,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1556:17),_kj::_::PropagateException>
                 ::anon_class_16_2_66fb283b_for_func::operator());
      pHVar7 = (HttpInputStreamImpl *)local_68._8_8_;
      (this_00->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)&PTR_onReady_00442100;
      (this_00->headerBuffer).disposer = (ArrayDisposer *)buffer;
      this_00->messageHeaderEnd = (size_t)in_R9;
      PVar3.node.ptr = extraout_RDX_01;
      PVar3.node.disposer =
           (Disposer *)
           &_::
            HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,unsigned_long,kj::(anonymous_namespace)::HttpChunkedEntityReader::tryReadInternal(void*,unsigned_long,unsigned_long,unsigned_long)::{lambda(unsigned_long)#3},kj::_::PropagateException>>
            ::instance;
      (local_38->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream =
           (_func_int **)
           &_::
            HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,unsigned_long,kj::(anonymous_namespace)::HttpChunkedEntityReader::tryReadInternal(void*,unsigned_long,unsigned_long,unsigned_long)::{lambda(unsigned_long)#3},kj::_::PropagateException>>
            ::instance;
      (local_38->super_HttpEntityBodyReader).inner = this_00;
      if ((HttpInputStreamImpl *)local_68._8_8_ == (HttpInputStreamImpl *)0x0) {
        return (Promise<unsigned_long>)PVar3.node;
      }
      local_68._8_8_ = (HttpInputStreamImpl *)0x0;
      goto LAB_002b9e27;
    }
    HttpInputStreamImpl::tryRead
              ((HttpInputStreamImpl *)local_58,*(void **)((long)buffer + 8),minBytes,maxBytes_00);
    pTVar6 = (TransformPromiseNodeBase *)operator_new(0x50);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar6,(Own<kj::_::PromiseNode> *)local_58,
               _::
               TransformPromiseNode<kj::Promise<unsigned_long>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1544:17),_kj::_::PropagateException>
               ::anon_class_40_5_00d635ec_for_func::operator());
    (pTVar6->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00442078;
    pTVar6[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)buffer;
    pTVar6[1].dependency.disposer = (Disposer *)minBytes;
    pTVar6[1].dependency.ptr = (PromiseNode *)maxBytes;
    pTVar6[1].continuationTracePtr = (void *)alreadyRead;
    pTVar6[2].super_PromiseNode._vptr_PromiseNode = in_R9;
    local_58._16_8_ =
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,unsigned_long,kj::(anonymous_namespace)::HttpChunkedEntityReader::tryReadInternal(void*,unsigned_long,unsigned_long,unsigned_long)::{lambda(unsigned_long)#2},kj::_::PropagateException>>
          ::instance;
    local_40 = pTVar6;
    OVar11 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>
                       ((kj *)local_68,(Own<kj::_::PromiseNode> *)(local_58 + 0x10));
    pTVar6 = local_40;
    pCVar9 = OVar11.ptr;
    *(undefined4 *)
     &(local_38->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream =
         local_68._0_4_;
    *(undefined4 *)
     ((long)&(local_38->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream +
     4) = local_68._4_4_;
    *(undefined4 *)&(local_38->super_HttpEntityBodyReader).inner = local_68._8_4_;
    *(undefined4 *)((long)&(local_38->super_HttpEntityBodyReader).inner + 4) = local_68._12_4_;
    pHVar8 = local_38;
    if (local_40 != (TransformPromiseNodeBase *)0x0) {
      local_40 = (TransformPromiseNodeBase *)0x0;
      iVar5 = (***(_func_int ***)local_58._16_8_)
                        (local_58._16_8_,
                         (pTVar6->super_PromiseNode)._vptr_PromiseNode[-2] +
                         (long)&(pTVar6->super_PromiseNode)._vptr_PromiseNode);
      pHVar8 = (HttpChunkedEntityReader *)CONCAT44(extraout_var,iVar5);
      pCVar9 = extraout_RDX;
    }
  }
  pHVar7 = (HttpInputStreamImpl *)local_58._8_8_;
  PVar2.node.ptr = &pCVar9->super_PromiseNode;
  PVar2.node.disposer = (Disposer *)pHVar8;
  if ((HttpInputStreamImpl *)local_58._8_8_ == (HttpInputStreamImpl *)0x0) {
    return (Promise<unsigned_long>)PVar2.node;
  }
  local_58._8_8_ = (HttpInputStreamImpl *)0x0;
  local_68._0_8_ = local_58._0_8_;
LAB_002b9e27:
  PVar2.node = (Own<kj::_::PromiseNode>)
               (**(code **)*(_func_int **)local_68._0_8_)
                         (local_68._0_8_,
                          (pHVar7->super_HttpInputStream)._vptr_HttpInputStream[-2] +
                          (long)&(pHVar7->super_HttpInputStream)._vptr_HttpInputStream);
  return (PromiseBase)(PromiseBase)PVar2.node;
}

Assistant:

Promise<size_t> tryReadInternal(void* buffer, size_t minBytes, size_t maxBytes,
                                  size_t alreadyRead) {
    if (alreadyDone()) {
      return alreadyRead;
    } else if (chunkSize == 0) {
      // Read next chunk header.
      return inner.readChunkHeader().then([=](uint64_t nextChunkSize) {
        if (nextChunkSize == 0) {
          doneReading();
        }

        chunkSize = nextChunkSize;
        return tryReadInternal(buffer, minBytes, maxBytes, alreadyRead);
      });
    } else if (chunkSize < minBytes) {
      // Read entire current chunk and continue to next chunk.
      return inner.tryRead(buffer, chunkSize, chunkSize)
          .then([=](size_t amount) -> kj::Promise<size_t> {
        chunkSize -= amount;
        if (chunkSize > 0) {
          return KJ_EXCEPTION(DISCONNECTED, "premature EOF in HTTP chunk");
        }

        return tryReadInternal(reinterpret_cast<byte*>(buffer) + amount,
                               minBytes - amount, maxBytes - amount, alreadyRead + amount);
      });
    } else {
      // Read only part of the current chunk.
      return inner.tryRead(buffer, minBytes, kj::min(maxBytes, chunkSize))
          .then([=](size_t amount) -> size_t {
        chunkSize -= amount;
        return alreadyRead + amount;
      });
    }
  }